

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

Element * Rml::QuerySelectorMatchRecursive
                    (StyleSheetNodeListRaw *nodes,Element *element,Element *scope)

{
  bool bVar1;
  int iVar2;
  Element *pEVar3;
  String *__lhs;
  reference ppSVar4;
  Element *matching_element;
  StyleSheetNode *node;
  const_iterator __end2;
  const_iterator __begin2;
  StyleSheetNodeListRaw *__range2;
  Element *child;
  int i;
  int num_children;
  Element *scope_local;
  Element *element_local;
  StyleSheetNodeListRaw *nodes_local;
  
  iVar2 = Element::GetNumChildren(element,false);
  child._0_4_ = 0;
  do {
    if (iVar2 <= (int)child) {
      return (Element *)0x0;
    }
    pEVar3 = Element::GetChild(element,(int)child);
    __lhs = Element::GetTagName_abi_cxx11_(pEVar3);
    bVar1 = ::std::operator==(__lhs,"#text");
    if (!bVar1) {
      __end2 = ::std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::begin
                         (nodes);
      node = (StyleSheetNode *)
             ::std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::end
                       (nodes);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<Rml::StyleSheetNode_*const_*,_std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>_>
                                         *)&node), bVar1) {
        ppSVar4 = __gnu_cxx::
                  __normal_iterator<Rml::StyleSheetNode_*const_*,_std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>_>
                  ::operator*(&__end2);
        bVar1 = StyleSheetNode::IsApplicable(*ppSVar4,pEVar3,scope);
        if (bVar1) {
          return pEVar3;
        }
        __gnu_cxx::
        __normal_iterator<Rml::StyleSheetNode_*const_*,_std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>_>
        ::operator++(&__end2);
      }
      pEVar3 = QuerySelectorMatchRecursive(nodes,pEVar3,scope);
      if (pEVar3 != (Element *)0x0) {
        return pEVar3;
      }
    }
    child._0_4_ = (int)child + 1;
  } while( true );
}

Assistant:

static Element* QuerySelectorMatchRecursive(const StyleSheetNodeListRaw& nodes, Element* element, Element* scope)
{
	const int num_children = element->GetNumChildren();

	for (int i = 0; i < num_children; i++)
	{
		Element* child = element->GetChild(i);
		if (child->GetTagName() == "#text")
			continue;

		for (const StyleSheetNode* node : nodes)
		{
			if (node->IsApplicable(child, scope))
				return child;
		}

		Element* matching_element = QuerySelectorMatchRecursive(nodes, child, scope);
		if (matching_element)
			return matching_element;
	}

	return nullptr;
}